

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread.cc
# Opt level: O0

int ixxx::posix::pthread_create
              (pthread_t *__newthread,pthread_attr_t *__attr,__start_routine *__start_routine,
              void *__arg)

{
  int iVar1;
  pthread_create_error *this;
  int r;
  void *arg_local;
  _func_void_ptr_void_ptr *start_routine_local;
  pthread_attr_t *attr_local;
  pthread_t *thread_local;
  
  iVar1 = ::pthread_create(__newthread,__attr,__start_routine,__arg);
  if (iVar1 != 0) {
    this = (pthread_create_error *)__cxa_allocate_exception(0x20);
    pthread_create_error::sys_error(this,iVar1,(char *)0x0,ERRNO);
    __cxa_throw(this,&pthread_create_error::typeinfo,pthread_create_error::~pthread_create_error);
  }
  return 0;
}

Assistant:

void pthread_create(pthread_t *thread, const pthread_attr_t *attr,
                void *(*start_routine) (void *), void *arg)
        {
            int r = ::pthread_create(thread, attr, start_routine, arg);
            if (r)
                throw pthread_create_error(r);
        }